

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_coroutine.hpp
# Opt level: O3

int __thiscall squall::Coroutine::result<int>(Coroutine *this)

{
  HSQUIRRELVM vm;
  RestoreStack r;
  longlong r_1;
  RestoreStack local_20;
  int local_10 [2];
  
  validate_vm(this);
  local_20.top_ = this->top_;
  vm = this->vm_;
  local_20.vm_ = &this->vm_;
  detail::check_argument_type<(squall::detail::FetchContext)1>(vm,-1,OT_INTEGER);
  sq_getinteger(vm,-1,(SQInteger *)local_10);
  RestoreStack::~RestoreStack(&local_20);
  return local_10[0];
}

Assistant:

R result() {
        validate_vm();
        RestoreStack r(vm_, top_);
        return detail::call_teardown<R>(vm_);
    }